

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QSize __thiscall QListView::viewportSizeHint(QListView *this)

{
  QListViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QSize QVar5;
  QSize QVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  QModelIndex local_160;
  undefined1 *local_148;
  undefined1 *puStack_140;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_138;
  QStyleOptionViewItem local_128;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
  if (pQVar1 != (QAbstractItemModel *)0x0) {
    local_128.super_QStyleOption.version = -1;
    local_128.super_QStyleOption.type = -1;
    local_128.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
    local_128.super_QStyleOption.direction = LeftToRight;
    local_128.super_QStyleOption.rect.x1.m_i = 0;
    local_128.super_QStyleOption.rect.y1.m_i = 0;
    iVar2 = (**(code **)(*(long *)pQVar1 + 0x78))();
    if ((iVar2 != 0) &&
       (*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                            super_QWidget.field_0x8 + 0x548) != '\x01')) {
      memset(&local_128,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&local_128);
      (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                             super_QWidget + 0x2f8))(this,&local_128);
      if (*(char *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame
                              .super_QWidget.field_0x8 + 0x594) == '\x01') {
        QVar5 = this_00->cachedItemSize;
        if (((ulong)QVar5 & 0x8000000080000000) != 0) {
          local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar4 = this_00->column;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&local_148,&(this_00->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,0,iVar4,(QModelIndex *)&local_148);
          QVar5 = QListViewPrivate::itemSize(this_00,&local_128,(QModelIndex *)&local_58);
        }
        uVar7 = (ulong)(uint)(iVar2 * QVar5.ht.m_i.m_i);
      }
      else {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QObject::property((char *)local_58.data);
        iVar4 = 1000;
        if (((undefined1 *)0x3 < puStack_40) &&
           (iVar3 = ::QVariant::toInt((bool *)local_58.data), 0 < iVar3)) {
          iVar4 = ::QVariant::toInt((bool *)local_58.data);
        }
        if (iVar2 < iVar4) {
          iVar4 = iVar2;
        }
        if (iVar4 < 1) {
          QVar5.wd.m_i = 0;
          QVar5.ht.m_i = 0;
          uVar7 = 0;
        }
        else {
          iVar2 = 0;
          uVar7 = 0;
          QVar5.wd.m_i = 0;
          QVar5.ht.m_i = 0;
          do {
            local_138.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_148 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
            pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
            iVar3 = this_00->column;
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      (&local_160,&(this_00->super_QAbstractItemViewPrivate).root);
            (**(code **)(*(long *)pQVar1 + 0x60))(&local_148,pQVar1,iVar2,iVar3,&local_160);
            QVar6 = QListViewPrivate::itemSize(this_00,&local_128,(QModelIndex *)&local_148);
            uVar7 = (ulong)(uint)((int)uVar7 + QVar6.ht.m_i.m_i);
            if (QVar5.wd.m_i.m_i <= QVar6.wd.m_i.m_i) {
              QVar5 = QVar6;
            }
            QVar5 = (QSize)((ulong)QVar5 & 0xffffffff);
            iVar2 = iVar2 + 1;
          } while (iVar4 != iVar2);
        }
        ::QVariant::~QVariant((QVariant *)&local_58);
      }
      QBrush::~QBrush(&local_128.backgroundBrush);
      if (&(local_128.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_128.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_128.text.d.d)->super_QArrayData,2,0x10);
        }
      }
      QIcon::~QIcon(&local_128.icon);
      QLocale::~QLocale(&local_128.locale);
      QFont::~QFont(&local_128.font);
      QStyleOption::~QStyleOption(&local_128.super_QStyleOption);
      goto LAB_0057fc9c;
    }
  }
  QVar5 = QAbstractItemView::viewportSizeHint((QAbstractItemView *)this);
  uVar7 = (ulong)QVar5 >> 0x20;
LAB_0057fc9c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSize)((ulong)QVar5 & 0xffffffff | uVar7 << 0x20);
}

Assistant:

QSize QListView::viewportSizeHint() const
{
    Q_D(const QListView);
    // We don't have a nice simple size hint for invalid or wrapping list views.
    if (!d->model)
        return QAbstractItemView::viewportSizeHint();
    const int rc = d->model->rowCount();
    if (rc == 0 || isWrapping())
        return QAbstractItemView::viewportSizeHint();

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    if (uniformItemSizes()) {
        QSize sz = d->cachedItemSize;
        if (!sz.isValid()) {
            QModelIndex idx = d->model->index(0, d->column, d->root);
            sz = d->itemSize(option, idx);
        }
        sz.setHeight(rc * sz.height());
        return sz;
    }

    // Using AdjustToContents with a high number of rows will normally not make sense, so we limit
    // this to default 1000 (that is btw the default for QHeaderView::resizeContentsPrecision())
    // (By setting the property _q_resizeContentPrecision the user can however override this).
    int maximumRows = 1000;
    const QVariant userOverrideValue = property("_q_resizeContentPrecision");
    if (userOverrideValue.isValid() && userOverrideValue.toInt() > 0) {
      maximumRows = userOverrideValue.toInt();
    }
    const int rowCount = qMin(rc, maximumRows);

    int h = 0;
    int w = 0;

    for (int row = 0; row < rowCount; ++row) {
        QModelIndex idx = d->model->index(row, d->column, d->root);
        QSize itemSize = d->itemSize(option, idx);
        h += itemSize.height();
        w = qMax(w, itemSize.width());
    }
    return QSize(w, h);
}